

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

string * SimpleWeb::Crypto::Base64::decode(string *__return_storage_ptr__,string *base64)

{
  int iVar1;
  BIO_METHOD *type;
  BIO *b;
  void *pvVar2;
  BIO *pBVar3;
  int decoded_length;
  BIO *bio;
  BIO *b64;
  string *base64_local;
  string *ascii;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  type = BIO_f_base64();
  b = BIO_new(type);
  BIO_set_flags(b,0x100);
  pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)base64);
  iVar1 = std::__cxx11::string::size();
  pBVar3 = BIO_new_mem_buf(pvVar2,iVar1);
  pBVar3 = BIO_push(b,pBVar3);
  pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  iVar1 = std::__cxx11::string::size();
  iVar1 = BIO_read(pBVar3,pvVar2,iVar1);
  if (iVar1 < 1) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  BIO_free_all(b);
  return __return_storage_ptr__;
}

Assistant:

static std::string decode(const std::string &base64) noexcept {
        std::string ascii;

        // Resize ascii, however, the size is a up to two bytes too large.
        ascii.resize((6 * base64.size()) / 8);
        BIO *b64, *bio;

        b64 = BIO_new(BIO_f_base64());
        BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);
// TODO: Remove in 2022 or later
#if(defined(OPENSSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER < 0x1000214fL) || (defined(LIBRESSL_VERSION_NUMBER) && LIBRESSL_VERSION_NUMBER < 0x2080000fL)
        bio = BIO_new_mem_buf(const_cast<char *>(&base64[0]), static_cast<int>(base64.size()));
#else
        bio = BIO_new_mem_buf(&base64[0], static_cast<int>(base64.size()));
#endif
        bio = BIO_push(b64, bio);

        auto decoded_length = BIO_read(bio, &ascii[0], static_cast<int>(ascii.size()));
        if(decoded_length > 0)
          ascii.resize(static_cast<std::size_t>(decoded_length));
        else
          ascii.clear();

        BIO_free_all(b64);

        return ascii;
      }